

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void __thiscall cmTarget::GetTllSignatureTraces(cmTarget *this,ostringstream *s,TLLSignature sig)

{
  pointer pcVar1;
  Snapshot snapshot;
  ostringstream *os;
  ostream *poVar2;
  string *source;
  pointer ppVar3;
  char *pcVar4;
  cmListFileContext lfc;
  cmOutputConverter converter;
  cmListFileContext local_d8;
  ostringstream *local_90;
  string local_88;
  cmOutputConverter local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  PositionType local_38;
  
  pcVar4 = "plain";
  if (sig == KeywordTLLSignature) {
    pcVar4 = "keyword";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)s,"The uses of the ",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)s,pcVar4,(ulong)(sig == KeywordTLLSignature) * 2 + 5);
  local_90 = s;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)s," signature are here:\n",0x15);
  cmMakefile::GetStateSnapshot(this->Makefile);
  snapshot.Position.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)uStack_40;
  snapshot.State = (cmState *)local_48;
  snapshot.Position.Position = local_38;
  cmOutputConverter::cmOutputConverter(&local_68,snapshot);
  ppVar3 = (this->TLLCommands).
           super__Vector_base<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar3 != (this->TLLCommands).
                super__Vector_base<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      source = &local_d8.FilePath;
      if (ppVar3->first == sig) {
        local_d8.Name._M_dataplus._M_p = (pointer)&local_d8.Name.field_2;
        pcVar1 = (ppVar3->second).Name._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d8,pcVar1,pcVar1 + (ppVar3->second).Name._M_string_length);
        local_d8.FilePath._M_dataplus._M_p = (pointer)&local_d8.FilePath.field_2;
        pcVar1 = (ppVar3->second).FilePath._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)source,pcVar1,pcVar1 + (ppVar3->second).FilePath._M_string_length);
        local_d8.Line = (ppVar3->second).Line;
        cmOutputConverter::Convert(&local_88,&local_68,source,HOME,UNCHANGED);
        std::__cxx11::string::operator=((string *)source,(string *)&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        os = local_90;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_90," * ",3);
        poVar2 = operator<<((ostream *)os,&local_d8);
        std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8.FilePath._M_dataplus._M_p != &local_d8.FilePath.field_2) {
          operator_delete(local_d8.FilePath._M_dataplus._M_p,
                          local_d8.FilePath.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8.Name._M_dataplus._M_p != &local_d8.Name.field_2) {
          operator_delete(local_d8.Name._M_dataplus._M_p,
                          local_d8.Name.field_2._M_allocated_capacity + 1);
        }
      }
      ppVar3 = ppVar3 + 1;
    } while (ppVar3 != (this->TLLCommands).
                       super__Vector_base<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void cmTarget::GetTllSignatureTraces(std::ostringstream &s,
                                     TLLSignature sig) const
{
  const char *sigString = (sig == cmTarget::KeywordTLLSignature ? "keyword"
                                                                : "plain");
  s << "The uses of the " << sigString << " signature are here:\n";
  typedef std::vector<std::pair<TLLSignature, cmListFileContext> > Container;
  cmOutputConverter converter(this->GetMakefile()->GetStateSnapshot());
  for(Container::const_iterator it = this->TLLCommands.begin();
      it != this->TLLCommands.end(); ++it)
    {
    if (it->first == sig)
      {
      cmListFileContext lfc = it->second;
      lfc.FilePath = converter.Convert(lfc.FilePath, cmOutputConverter::HOME);
      s << " * " << lfc << std::endl;
      }
    }
}